

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qslider.cpp
# Opt level: O1

void __thiscall QSlider::mouseReleaseEvent(QSlider *this,QMouseEvent *ev)

{
  undefined8 uVar1;
  Int IVar2;
  QStyle *pQVar3;
  long lVar4;
  undefined8 *puVar5;
  QStyleOptionSlider *pQVar6;
  long in_FS_OFFSET;
  byte bVar7;
  QStyleOptionSlider opt;
  QRect local_b0;
  QStyleOptionSlider local_a0;
  long local_20;
  
  bVar7 = 0;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = *(long *)&(this->super_QAbstractSlider).super_QWidget.field_0x8;
  IVar2 = *(Int *)(lVar4 + 0x290);
  if ((IVar2 == 0) || (*(int *)(ev + 0x44) != 0)) {
    ev[0xc] = (QMouseEvent)0x0;
  }
  else {
    ev[0xc] = (QMouseEvent)0x1;
    *(undefined4 *)(lVar4 + 0x290) = 0;
    QAbstractSlider::setRepeatAction(&this->super_QAbstractSlider,SliderNoAction,500,0x32);
    if (IVar2 == 2) {
      QAbstractSlider::setSliderDown(&this->super_QAbstractSlider,false);
    }
    puVar5 = &DAT_006ebcf0;
    pQVar6 = &local_a0;
    for (lVar4 = 0x10; lVar4 != 0; lVar4 = lVar4 + -1) {
      uVar1 = *puVar5;
      (pQVar6->super_QStyleOptionComplex).super_QStyleOption.version = (int)uVar1;
      (pQVar6->super_QStyleOptionComplex).super_QStyleOption.type = (int)((ulong)uVar1 >> 0x20);
      puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      pQVar6 = (QStyleOptionSlider *)((long)pQVar6 + (ulong)bVar7 * -0x10 + 8);
    }
    QStyleOptionSlider::QStyleOptionSlider(&local_a0);
    (**(code **)(*(long *)&(this->super_QAbstractSlider).super_QWidget + 0x1a8))(this,&local_a0);
    local_a0.super_QStyleOptionComplex.subControls.super_QFlagsStorageHelper<QStyle::SubControl,_4>.
    super_QFlagsStorage<QStyle::SubControl>.i =
         (QFlagsStorageHelper<QStyle::SubControl,_4>)
         (QFlagsStorageHelper<QStyle::SubControl,_4>)IVar2;
    pQVar3 = QWidget::style((QWidget *)this);
    local_b0 = (QRect)(**(code **)(*(long *)pQVar3 + 0xd8))(pQVar3,3,&local_a0,IVar2,this);
    QWidget::update((QWidget *)this,&local_b0);
    QStyleOption::~QStyleOption((QStyleOption *)&local_a0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSlider::mouseReleaseEvent(QMouseEvent *ev)
{
    Q_D(QSlider);
    if (d->pressedControl == QStyle::SC_None || ev->buttons()) {
        ev->ignore();
        return;
    }
    ev->accept();
    QStyle::SubControl oldPressed = QStyle::SubControl(d->pressedControl);
    d->pressedControl = QStyle::SC_None;
    setRepeatAction(SliderNoAction);
    if (oldPressed == QStyle::SC_SliderHandle)
        setSliderDown(false);
    QStyleOptionSlider opt;
    initStyleOption(&opt);
    opt.subControls = oldPressed;
    update(style()->subControlRect(QStyle::CC_Slider, &opt, oldPressed, this));
}